

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
::rebalance_or_split
          (btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
           *this,iterator *iter)

{
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *this_00;
  int iVar1;
  int iVar2;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *pbVar3;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *pbVar4;
  node_type *dest;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  bVar5;
  char *__function;
  iterator parent_iter;
  iterator local_38;
  
  pbVar3 = iter->node;
  if (((ulong)pbVar3 & 7) == 0) {
    bVar5 = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
             )0xa;
    if (pbVar3[0xb] !=
        (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
         )0x0) {
      bVar5 = pbVar3[0xb];
    }
    if (pbVar3[10] != bVar5) {
      __assert_fail("node->count() == node->max_count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb53,
                    "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                   );
    }
    if (bVar5 != (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                  )0xa) {
      __assert_fail("kNodeValues == node->max_count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb54,
                    "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                   );
    }
    pbVar4 = *(btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               **)pbVar3;
    if (pbVar3 == (this->root_).
                  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
                  .
                  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*,_false>
                  ._M_head_impl) {
      pbVar3 = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                *)Allocate<8ul,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>>
                            ((allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>
                              *)this,0x158);
      pbVar4 = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               ::init_internal(pbVar3,pbVar4);
      btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
      ::init_child(pbVar4,0,(this->root_).
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*,_false>
                            ._M_head_impl);
      (this->root_).
      super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>_*,_false>
      ._M_head_impl = pbVar4;
      pbVar3 = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               ::child(pbVar4,0);
      if (((ulong)pbVar3 & 7) == 0) {
        if ((pbVar3[0xb] !=
             (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
              )0x0) &&
           (pbVar3 = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                     ::child(pbVar4,0), pbVar3 != this->rightmost_)) {
          __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xba0,
                        "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                       );
        }
LAB_0026c09b:
        if (((ulong)iter->node & 7) == 0) {
          if (iter->node[0xb] ==
              (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               )0x0) {
            pbVar3 = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                      *)Allocate<8ul,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>>
                                  ((allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>
                                    *)this,0x158);
            dest = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   ::init_internal(pbVar3,pbVar4);
            btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            ::split(iter->node,iter->position,dest,(allocator_type *)this);
          }
          else {
            dest = new_leaf_node(this,pbVar4);
            btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            ::split(iter->node,iter->position,dest,(allocator_type *)this);
            if (this->rightmost_ == iter->node) {
              this->rightmost_ = dest;
            }
          }
          if (((ulong)iter->node & 7) == 0) {
            bVar5 = iter->node[10];
            if ((int)(uint)(byte)bVar5 < iter->position) {
              iter->position = iter->position + ~(uint)(byte)bVar5;
              iter->node = dest;
            }
            return;
          }
        }
      }
    }
    else {
      if ((ulong)(byte)pbVar3[8] != 0) {
        pbVar3 = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                 ::child(pbVar4,(ulong)(byte)pbVar3[8] - 1);
        if (((ulong)pbVar3 & 7) != 0) goto LAB_0026c195;
        if ((pbVar3[0xb] !=
             (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
              )0x0) &&
           (pbVar3[0xb] !=
            (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
             )0xa)) {
          __assert_fail("left->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb5c,
                        "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                       );
        }
        bVar5 = pbVar3[10];
        if ((byte)bVar5 < 10) {
          iVar1 = (int)(10 - (uint)(byte)bVar5) / (int)((iter->position < 10) + 1);
          iVar2 = 1;
          if (1 < iVar1) {
            iVar2 = iVar1;
          }
          if ((uint)(byte)bVar5 + iVar2 < 10 || iVar2 <= iter->position) {
            btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            ::rebalance_right_to_left(pbVar3,iVar2,iter->node,(allocator_type *)this);
            pbVar4 = iter->node;
            if (((ulong)pbVar4 & 7) == 0) {
              bVar5 = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                       )0xa;
              if (pbVar4[0xb] !=
                  (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   )0x0) {
                bVar5 = pbVar4[0xb];
              }
              if ((uint)(byte)bVar5 - (uint)(byte)pbVar4[10] != iVar2) {
                __assert_fail("node->max_count() - node->count() == to_move",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xb69,
                              "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                             );
              }
              iVar2 = iter->position - iVar2;
              iter->position = iVar2;
              if (iVar2 < 0) {
                iter->position = iVar2 + (uint)(byte)pbVar3[10] + 1;
                iter->node = pbVar3;
              }
              pbVar3 = iter->node;
              if (((ulong)pbVar3 & 7) == 0) {
                bVar5 = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                         )0xa;
                if (pbVar3[0xb] !=
                    (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                     )0x0) {
                  bVar5 = pbVar3[0xb];
                }
                if ((byte)pbVar3[10] < (byte)bVar5) {
                  return;
                }
                __assert_fail("node->count() < node->max_count()",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xb70,
                              "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                             );
              }
            }
            goto LAB_0026c195;
          }
        }
      }
      if ((((ulong)iter->node & 7) == 0) && (((ulong)pbVar4 & 7) == 0)) {
        bVar5 = iter->node[8];
        if ((byte)pbVar4[10] <= (byte)bVar5) {
LAB_0026c006:
          if ((pbVar4[0xb] !=
               (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                )0x0) &&
             (pbVar4[0xb] !=
              (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               )0xa)) {
            __assert_fail("parent->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb93,
                          "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                         );
          }
          if (pbVar4[10] ==
              (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               )0xa) {
            pbVar3 = iter->node;
            if (((ulong)pbVar3 & 7) != 0) {
              __function = 
              "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
              ;
              goto LAB_0026c1aa;
            }
            local_38.node =
                 *(btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   **)pbVar3;
            local_38.position = (int)(byte)pbVar3[8];
            rebalance_or_split(this,&local_38);
          }
          goto LAB_0026c09b;
        }
        pbVar3 = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                 ::child(pbVar4,(ulong)(byte)bVar5 + 1);
        if (((ulong)pbVar3 & 7) == 0) {
          if ((pbVar3[0xb] !=
               (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                )0x0) &&
             (pbVar3[0xb] !=
              (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               )0xa)) {
            __assert_fail("right->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb79,
                          "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                         );
          }
          bVar5 = pbVar3[10];
          if (9 < (byte)bVar5) goto LAB_0026c006;
          iVar1 = (int)(10 - (uint)(byte)bVar5) / (int)((0 < iter->position) + 1);
          iVar2 = 1;
          if (1 < iVar1) {
            iVar2 = iVar1;
          }
          this_00 = iter->node;
          if (((ulong)this_00 & 7) == 0) {
            if (((int)((uint)(byte)this_00[10] - iVar2) < iter->position) &&
               (9 < (uint)(byte)bVar5 + iVar2)) goto LAB_0026c006;
            btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            ::rebalance_left_to_right(this_00,iVar2,pbVar3,(allocator_type *)this);
            if (((ulong)iter->node & 7) == 0) {
              bVar5 = iter->node[10];
              if ((int)(uint)(byte)bVar5 < iter->position) {
                iter->position = iter->position + ~(uint)(byte)bVar5;
                iter->node = pbVar3;
              }
              pbVar3 = iter->node;
              if (((ulong)pbVar3 & 7) == 0) {
                bVar5 = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                         )0xa;
                if (pbVar3[0xb] !=
                    (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                     )0x0) {
                  bVar5 = pbVar3[0xb];
                }
                if ((byte)pbVar3[10] < (byte)bVar5) {
                  return;
                }
                __assert_fail("node->count() < node->max_count()",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xb8b,
                              "void phmap::priv::btree<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                             );
              }
            }
          }
        }
      }
    }
  }
LAB_0026c195:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_0026c1aa:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }